

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumbuilder.cpp
# Opt level: O1

EnumBuilder * __thiscall camp::EnumBuilder::value(EnumBuilder *this,string *name,long value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Pair pair;
  value_type local_48;
  
  bVar2 = Enum::hasName(this->m_target,name);
  if (bVar2) {
    __assert_fail("!m_target->hasName(name)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enumbuilder.cpp"
                  ,0x2f,"EnumBuilder &camp::EnumBuilder::value(const std::string &, long)");
  }
  bVar2 = Enum::hasValue(this->m_target,value);
  if (!bVar2) {
    paVar1 = &local_48.name.field_2;
    local_48.name._M_string_length = 0;
    local_48.name.field_2._M_local_buf[0] = '\0';
    local_48.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_48);
    local_48.value = value;
    boost::multi_index::detail::
    random_access_index<boost::multi_index::detail::nth_layer<1,_camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>,_boost::mpl::v_item<camp::Enum::Id,_boost::mpl::vector0<mpl_::na>,_0>_>
    ::insert(&(this->m_target->m_pairs).super_type,
             (this->m_target->m_pairs).
             super_header_holder<boost::multi_index::detail::random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>_>_*,_boost::multi_index::multi_index_container<camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>_>
             .member,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.name._M_dataplus._M_p);
    }
    return this;
  }
  __assert_fail("!m_target->hasValue(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enumbuilder.cpp"
                ,0x30,"EnumBuilder &camp::EnumBuilder::value(const std::string &, long)");
}

Assistant:

EnumBuilder& EnumBuilder::value(const std::string& name, long value)
{
    assert(!m_target->hasName(name));
    assert(!m_target->hasValue(value));

    Enum::Pair pair;
    pair.name = name;
    pair.value = value;
    m_target->m_pairs.push_back(pair);

    return *this;
}